

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::getp_getJulianDate(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t dayno;
  CVmTimeZone *tz;
  uint argc;
  undefined4 in_register_00000034;
  int d;
  int m;
  int y;
  caldate_t cd;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_getJulianDate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_getJulianDate(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_getJulianDate::desc.min_argc_ = 0;
      getp_getJulianDate::desc.opt_argc_ = 1;
      getp_getJulianDate::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getJulianDate(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getJulianDate::desc);
  if (iVar1 == 0) {
    tz = get_tz_arg(0,argc);
    dayno = get_local_date(this,tz);
    caldate_t::set_dayno(&cd,dayno);
    caldate_t::julian_date(&cd,&y,&m,&d);
    iVar1 = caldate_t::weekday(&cd);
    make_int_list(retval,4,(ulong)(uint)y,(ulong)(uint)m,(ulong)(uint)d,(ulong)(iVar1 + 1));
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getJulianDate(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date in local time */
    int32_t dayno = get_local_date(get_tz_arg(vmg_ 0, argc));

    /* get the julian date */
    caldate_t cd(dayno);
    int y, m, d;
    cd.julian_date(y, m, d);

    /* 
     *   Return [year, month, monthday, weekday].  Note that there's no
     *   separate Julian weekday calculation, since the Julian calendar and
     *   Gregorian agree on the day of the week for every day.
     */
    make_int_list(vmg_ retval, 4, y, m, d, cd.weekday() + 1);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}